

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_mul_shortcuts
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              mbedtls_ecp_restart_ctx *rs_ctx)

{
  int iVar1;
  undefined1 local_48 [7];
  uchar nonzero;
  mbedtls_mpi tmp;
  int ret;
  mbedtls_ecp_restart_ctx *rs_ctx_local;
  mbedtls_ecp_point *P_local;
  mbedtls_mpi *m_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  tmp._12_4_ = 0xffffff92;
  mbedtls_mpi_init((mbedtls_mpi *)local_48);
  iVar1 = mbedtls_mpi_cmp_int(m,0);
  if (iVar1 == 0) {
    tmp._12_4_ = mbedtls_ecp_check_pubkey(grp,P);
    if (tmp._12_4_ == 0) {
      tmp._12_4_ = mbedtls_ecp_set_zero(R);
    }
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(m,1);
    if (iVar1 == 0) {
      tmp._12_4_ = mbedtls_ecp_check_pubkey(grp,P);
      if (tmp._12_4_ == 0) {
        tmp._12_4_ = mbedtls_ecp_copy(R,P);
      }
    }
    else {
      iVar1 = mbedtls_mpi_cmp_int(m,-1);
      if (iVar1 == 0) {
        tmp._12_4_ = mbedtls_ecp_check_pubkey(grp,P);
        if ((tmp._12_4_ == 0) && (tmp._12_4_ = mbedtls_ecp_copy(R,P), tmp._12_4_ == 0)) {
          iVar1 = mbedtls_mpi_cmp_int(&R->Y,0);
          tmp._12_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_48,&grp->P,&R->Y);
          if (tmp._12_4_ == 0) {
            tmp._12_4_ = mbedtls_mpi_safe_cond_assign(&R->Y,(mbedtls_mpi *)local_48,iVar1 != 0);
          }
        }
      }
      else {
        tmp._12_4_ = ecp_mul_restartable_internal
                               (grp,R,m,P,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,
                                rs_ctx);
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_48);
  return tmp._12_4_;
}

Assistant:

static int mbedtls_ecp_mul_shortcuts(mbedtls_ecp_group *grp,
                                     mbedtls_ecp_point *R,
                                     const mbedtls_mpi *m,
                                     const mbedtls_ecp_point *P,
                                     mbedtls_ecp_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi tmp;
    mbedtls_mpi_init(&tmp);

    if (mbedtls_mpi_cmp_int(m, 0) == 0) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
        MBEDTLS_MPI_CHK(mbedtls_ecp_set_zero(R));
    } else if (mbedtls_mpi_cmp_int(m, 1) == 0) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
        MBEDTLS_MPI_CHK(mbedtls_ecp_copy(R, P));
    } else if (mbedtls_mpi_cmp_int(m, -1) == 0) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_check_pubkey(grp, P));
        MBEDTLS_MPI_CHK(mbedtls_ecp_copy(R, P));
        MPI_ECP_NEG(&R->Y);
    } else {
        MBEDTLS_MPI_CHK(ecp_mul_restartable_internal(grp, R, m, P,
                                                     NULL, NULL, rs_ctx));
    }

cleanup:
    mbedtls_mpi_free(&tmp);

    return ret;
}